

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  RTCIntersectArguments *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  uint uVar20;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar21;
  byte bVar22;
  uint uVar23;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar24) [32];
  long lVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  byte bVar35;
  byte bVar36;
  long lVar37;
  ulong uVar38;
  float *vertices_2;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  size_t sVar43;
  bool bVar44;
  ulong uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined4 uVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  long lStack_2610;
  StackItemT<embree::NodeRefPtr<8>_> *local_25f0;
  int local_25d4;
  RayQueryContext *local_25d0;
  undefined1 local_25c8 [16];
  Geometry *local_25b8;
  Scene *local_25b0;
  long local_25a8;
  long local_25a0;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  float local_2538;
  undefined8 local_2528;
  undefined8 uStack_2520;
  undefined1 local_2518 [32];
  undefined1 local_24f8 [32];
  undefined1 local_24d8 [32];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  byte local_2477;
  float local_2468 [4];
  float local_2458 [4];
  undefined1 local_2448 [16];
  undefined1 local_2438 [16];
  undefined1 local_2428 [16];
  undefined1 local_2418 [16];
  undefined8 local_2408;
  undefined8 uStack_2400;
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_25f0 = stack + 1;
    stack[0].dist = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar46 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
    auVar91 = ZEXT1664(auVar46);
    auVar47 = vmaxss_avx512f(auVar46,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar75 = (ray->super_RayK<1>).tfar;
    auVar80 = ZEXT464((uint)fVar75);
    auVar48 = vmaxss_avx512f(auVar46,ZEXT416((uint)fVar75));
    auVar49._8_4_ = 0x7fffffff;
    auVar49._0_8_ = 0x7fffffff7fffffff;
    auVar49._12_4_ = 0x7fffffff;
    auVar49 = vandps_avx512vl((undefined1  [16])aVar2,auVar49);
    auVar52._8_4_ = 0x219392ef;
    auVar52._0_8_ = 0x219392ef219392ef;
    auVar52._12_4_ = 0x219392ef;
    uVar45 = vcmpps_avx512vl(auVar49,auVar52,1);
    bVar44 = (bool)((byte)uVar45 & 1);
    auVar65._0_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * (int)aVar2.x;
    bVar44 = (bool)((byte)(uVar45 >> 1) & 1);
    auVar65._4_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * (int)aVar2.y;
    bVar44 = (bool)((byte)(uVar45 >> 2) & 1);
    auVar65._8_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * (int)aVar2.z;
    bVar44 = (bool)((byte)(uVar45 >> 3) & 1);
    auVar65._12_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * aVar2.field_3.a;
    auVar49 = vrcp14ps_avx512vl(auVar65);
    auVar50._8_4_ = 0x3f800000;
    auVar50._0_8_ = 0x3f8000003f800000;
    auVar50._12_4_ = 0x3f800000;
    auVar50 = vfnmadd213ps_avx512vl(auVar65,auVar49,auVar50);
    vfmadd132ps_fma(auVar50,auVar49,auVar49);
    auVar50 = vucomiss_avx512f(auVar46);
    auVar67 = vbroadcastss_avx512vl(auVar50);
    auVar92 = ZEXT3264(auVar67);
    auVar49 = vmovshdup_avx(auVar50);
    auVar67 = vbroadcastsd_avx512vl(auVar49);
    auVar93 = ZEXT3264(auVar67);
    auVar70._8_4_ = 2;
    auVar70._0_8_ = 0x200000002;
    auVar70._12_4_ = 2;
    auVar70._16_4_ = 2;
    auVar70._20_4_ = 2;
    auVar70._24_4_ = 2;
    auVar70._28_4_ = 2;
    vshufpd_avx(auVar50,auVar50,1);
    auVar67 = vpermps_avx512vl(auVar70,ZEXT1632(auVar50));
    auVar94 = ZEXT3264(auVar67);
    fVar75 = auVar50._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar67 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar95 = ZEXT3264(auVar67);
    auVar69 = ZEXT1632(CONCAT412(auVar50._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar50._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar50._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar75))
                                ));
    auVar68 = vpermps_avx512vl(auVar67,auVar69);
    auVar67 = vpermps_avx2(auVar70,auVar69);
    lVar37 = 0;
    vucomiss_avx512f(auVar46);
    vucomiss_avx512f(auVar46);
    uVar81 = auVar47._0_4_;
    local_2398._4_4_ = uVar81;
    local_2398._0_4_ = uVar81;
    local_2398._8_4_ = uVar81;
    local_2398._12_4_ = uVar81;
    local_2398._16_4_ = uVar81;
    local_2398._20_4_ = uVar81;
    local_2398._24_4_ = uVar81;
    local_2398._28_4_ = uVar81;
    auVar85 = ZEXT3264(local_2398);
    uVar81 = auVar48._0_4_;
    auVar79 = ZEXT3264(CONCAT428(uVar81,CONCAT424(uVar81,CONCAT420(uVar81,CONCAT416(uVar81,CONCAT412
                                                  (uVar81,CONCAT48(uVar81,CONCAT44(uVar81,uVar81))))
                                                  ))));
    local_23b8._0_8_ = CONCAT44(fVar75,fVar75) ^ 0x8000000080000000;
    local_23b8._8_4_ = -fVar75;
    local_23b8._12_4_ = -fVar75;
    local_23b8._16_4_ = -fVar75;
    local_23b8._20_4_ = -fVar75;
    local_23b8._24_4_ = -fVar75;
    local_23b8._28_4_ = -fVar75;
    auVar86 = ZEXT3264(local_23b8);
    local_23d8._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
    local_23d8._8_4_ = auVar68._8_4_ ^ 0x80000000;
    local_23d8._12_4_ = auVar68._12_4_ ^ 0x80000000;
    local_23d8._16_4_ = auVar68._16_4_ ^ 0x80000000;
    local_23d8._20_4_ = auVar68._20_4_ ^ 0x80000000;
    local_23d8._24_4_ = auVar68._24_4_ ^ 0x80000000;
    local_23d8._28_4_ = auVar68._28_4_ ^ 0x80000000;
    auVar87 = ZEXT3264(local_23d8);
    local_23f8._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
    local_23f8._8_4_ = auVar67._8_4_ ^ 0x80000000;
    local_23f8._12_4_ = auVar67._12_4_ ^ 0x80000000;
    local_23f8._16_4_ = auVar67._16_4_ ^ 0x80000000;
    local_23f8._20_4_ = auVar67._20_4_ ^ 0x80000000;
    local_23f8._24_4_ = auVar67._24_4_ ^ 0x80000000;
    local_23f8._28_4_ = auVar67._28_4_ ^ 0x80000000;
    auVar88 = ZEXT3264(local_23f8);
    auVar67 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar89 = ZEXT3264(auVar67);
    auVar90 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    local_25d0 = context;
    local_25a8 = 0;
LAB_01c61712:
    if (local_25f0 != stack) {
      pSVar21 = local_25f0 + -1;
      local_25f0 = local_25f0 + -1;
      if ((float)pSVar21->dist <= auVar80._0_4_) {
        sVar43 = (local_25f0->ptr).ptr;
        do {
          while( true ) {
            uVar81 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar67._4_4_ = uVar81;
            auVar67._0_4_ = uVar81;
            auVar67._8_4_ = uVar81;
            auVar67._12_4_ = uVar81;
            auVar67._16_4_ = uVar81;
            auVar67._20_4_ = uVar81;
            auVar67._24_4_ = uVar81;
            auVar67._28_4_ = uVar81;
            do {
              if ((sVar43 & 8) != 0) {
                local_25a0 = (ulong)((uint)sVar43 & 0xf) - 8;
                uVar45 = sVar43 & 0xfffffffffffffff0;
                lVar25 = 0;
                goto LAB_01c61b10;
              }
              pauVar24 = (undefined1 (*) [32])(sVar43 & 0xfffffffffffffff0);
              auVar49 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + lVar37),auVar67,
                                        *(undefined1 (*) [32])(pauVar24[2] + lVar37));
              auVar68 = vfmadd213ps_avx512vl(ZEXT1632(auVar49),auVar92._0_32_,auVar86._0_32_);
              auVar68 = vmaxps_avx(auVar85._0_32_,auVar68);
              auVar49 = vfmadd213ps_fma(pauVar24[10],auVar67,pauVar24[4]);
              auVar50 = vfmadd213ps_fma(pauVar24[0xc],auVar67,pauVar24[6]);
              auVar69 = vfmadd213ps_avx512vl(ZEXT1632(auVar49),auVar93._0_32_,auVar87._0_32_);
              auVar70 = vfmadd213ps_avx512vl(ZEXT1632(auVar50),auVar94._0_32_,auVar88._0_32_);
              auVar69 = vmaxps_avx(auVar69,auVar70);
              auVar68 = vmaxps_avx(auVar68,auVar69);
              auVar49 = vfmadd213ps_fma(pauVar24[9],auVar67,pauVar24[3]);
              auVar69 = vfmadd213ps_avx512vl(ZEXT1632(auVar49),auVar92._0_32_,auVar86._0_32_);
              auVar69 = vminps_avx(auVar79._0_32_,auVar69);
              auVar49 = vfmadd213ps_fma(pauVar24[0xb],auVar67,pauVar24[5]);
              auVar50 = vfmadd213ps_fma(pauVar24[0xd],auVar67,pauVar24[7]);
              auVar70 = vfmadd213ps_avx512vl(ZEXT1632(auVar49),auVar93._0_32_,auVar87._0_32_);
              auVar71 = vfmadd213ps_avx512vl(ZEXT1632(auVar50),auVar94._0_32_,auVar88._0_32_);
              auVar70 = vminps_avx(auVar70,auVar71);
              auVar69 = vminps_avx(auVar69,auVar70);
              uVar45 = vcmpps_avx512vl(auVar68,auVar69,2);
              if (((uint)sVar43 & 7) == 6) {
                uVar27 = vcmpps_avx512vl(auVar67,pauVar24[0xe],0xd);
                uVar29 = vcmpps_avx512vl(auVar67,pauVar24[0xf],1);
                uVar45 = uVar45 & uVar27 & uVar29;
              }
              bVar22 = (byte)uVar45;
              if (bVar22 == 0) {
                auVar49 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                                 ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0))
                ;
                auVar80 = ZEXT1664(auVar49);
                goto LAB_01c61712;
              }
              auVar69 = *pauVar24;
              auVar70 = pauVar24[1];
              auVar71 = vpternlogd_avx512vl(auVar89._0_32_,auVar68,auVar90._0_32_,0xf8);
              auVar72 = vpcompressd_avx512vl(auVar71);
              auVar73._0_4_ =
                   (uint)(bVar22 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar22 & 1) * auVar71._0_4_;
              bVar44 = (bool)((byte)(uVar45 >> 1) & 1);
              auVar73._4_4_ = (uint)bVar44 * auVar72._4_4_ | (uint)!bVar44 * auVar71._4_4_;
              bVar44 = (bool)((byte)(uVar45 >> 2) & 1);
              auVar73._8_4_ = (uint)bVar44 * auVar72._8_4_ | (uint)!bVar44 * auVar71._8_4_;
              bVar44 = (bool)((byte)(uVar45 >> 3) & 1);
              auVar73._12_4_ = (uint)bVar44 * auVar72._12_4_ | (uint)!bVar44 * auVar71._12_4_;
              bVar44 = (bool)((byte)(uVar45 >> 4) & 1);
              auVar73._16_4_ = (uint)bVar44 * auVar72._16_4_ | (uint)!bVar44 * auVar71._16_4_;
              bVar44 = (bool)((byte)(uVar45 >> 5) & 1);
              auVar73._20_4_ = (uint)bVar44 * auVar72._20_4_ | (uint)!bVar44 * auVar71._20_4_;
              bVar44 = (bool)((byte)(uVar45 >> 6) & 1);
              auVar73._24_4_ = (uint)bVar44 * auVar72._24_4_ | (uint)!bVar44 * auVar71._24_4_;
              bVar44 = SUB81(uVar45 >> 7,0);
              auVar73._28_4_ = (uint)bVar44 * auVar72._28_4_ | (uint)!bVar44 * auVar71._28_4_;
              auVar71 = vpermt2q_avx512vl(auVar69,auVar73,auVar70);
              sVar43 = auVar71._0_8_;
              bVar22 = bVar22 - 1 & bVar22;
            } while (bVar22 == 0);
            auVar67 = vpshufd_avx2(auVar73,0x55);
            vpermt2q_avx512vl(auVar69,auVar67,auVar70);
            auVar71 = vpminsd_avx2(auVar73,auVar67);
            auVar67 = vpmaxsd_avx2(auVar73,auVar67);
            bVar22 = bVar22 - 1 & bVar22;
            if (bVar22 != 0) break;
            auVar71 = vpermi2q_avx512vl(auVar71,auVar69,auVar70);
            sVar43 = auVar71._0_8_;
            auVar69 = vpermt2q_avx512vl(auVar69,auVar67,auVar70);
            (local_25f0->ptr).ptr = auVar69._0_8_;
            lVar25 = 8;
            lStack_2610 = 0x10;
LAB_01c618cd:
            auVar67 = vpermd_avx2(auVar67,auVar68);
            *(int *)((long)&(local_25f0->ptr).ptr + lVar25) = auVar67._0_4_;
            local_25f0 = (StackItemT<embree::NodeRefPtr<8>_> *)
                         ((long)&(local_25f0->ptr).ptr + lStack_2610);
          }
          auVar15 = vpshufd_avx2(auVar73,0xaa);
          vpermt2q_avx512vl(auVar69,auVar15,auVar70);
          auVar72 = vpminsd_avx2(auVar71,auVar15);
          auVar71 = vpmaxsd_avx2(auVar71,auVar15);
          auVar15 = vpminsd_avx2(auVar67,auVar71);
          auVar71 = vpmaxsd_avx2(auVar67,auVar71);
          bVar22 = bVar22 - 1 & bVar22;
          if (bVar22 == 0) {
            auVar67 = vpermi2q_avx512vl(auVar72,auVar69,auVar70);
            sVar43 = auVar67._0_8_;
            auVar67 = vpermt2q_avx512vl(auVar69,auVar71,auVar70);
            (local_25f0->ptr).ptr = auVar67._0_8_;
            auVar67 = vpermd_avx2(auVar71,auVar68);
            local_25f0->dist = auVar67._0_4_;
            auVar67 = vpermt2q_avx512vl(auVar69,auVar15,auVar70);
            local_25f0[1].ptr.ptr = auVar67._0_8_;
            lStack_2610 = 0x18;
            lVar25 = lStack_2610;
            lStack_2610 = 0x20;
            auVar67 = auVar15;
            goto LAB_01c618cd;
          }
          auVar67 = vpshufd_avx2(auVar73,0xff);
          vpermt2q_avx512vl(auVar69,auVar67,auVar70);
          auVar14 = vpminsd_avx2(auVar72,auVar67);
          auVar72 = vpmaxsd_avx2(auVar72,auVar67);
          auVar67 = vpminsd_avx2(auVar15,auVar72);
          auVar72 = vpmaxsd_avx2(auVar15,auVar72);
          auVar15 = vpminsd_avx2(auVar71,auVar72);
          auVar71 = vpmaxsd_avx2(auVar71,auVar72);
          bVar22 = bVar22 - 1 & bVar22;
          if (bVar22 == 0) {
            auVar73 = vpermi2q_avx512vl(auVar14,auVar69,auVar70);
            sVar43 = auVar73._0_8_;
            auVar73 = vpermt2q_avx512vl(auVar69,auVar71,auVar70);
            (local_25f0->ptr).ptr = auVar73._0_8_;
            auVar71 = vpermd_avx2(auVar71,auVar68);
            local_25f0->dist = auVar71._0_4_;
            auVar71 = vpermt2q_avx512vl(auVar69,auVar15,auVar70);
            local_25f0[1].ptr.ptr = auVar71._0_8_;
            auVar71 = vpermd_avx2(auVar15,auVar68);
            local_25f0[1].dist = auVar71._0_4_;
            auVar69 = vpermt2q_avx512vl(auVar69,auVar67,auVar70);
            local_25f0[2].ptr.ptr = auVar69._0_8_;
            lVar25 = 0x28;
            lStack_2610 = 0x30;
            goto LAB_01c618cd;
          }
          auVar74 = valignd_avx512vl(auVar73,auVar73,3);
          auVar73 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
          auVar72 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                         CONCAT48(0x80000000,0x8000000080000000))),
                                      auVar73,auVar14);
          auVar73 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
          auVar67 = vpermt2d_avx512vl(auVar72,auVar73,auVar67);
          auVar73 = vpermt2d_avx512vl(auVar67,auVar73,auVar15);
          auVar67 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
          auVar67 = vpermt2d_avx512vl(auVar73,auVar67,auVar71);
          auVar80 = ZEXT3264(auVar67);
          bVar35 = bVar22;
          do {
            auVar71 = auVar80._0_32_;
            auVar67 = vpermps_avx512vl(auVar95._0_32_,auVar74);
            auVar74 = valignd_avx512vl(auVar74,auVar74,1);
            vpermt2q_avx512vl(auVar69,auVar74,auVar70);
            bVar35 = bVar35 - 1 & bVar35;
            uVar19 = vpcmpd_avx512vl(auVar67,auVar71,5);
            auVar67 = vpmaxsd_avx2(auVar67,auVar71);
            bVar36 = (byte)uVar19 << 1;
            auVar71 = valignd_avx512vl(auVar71,auVar71,7);
            bVar44 = (bool)((byte)uVar19 & 1);
            bVar7 = (bool)(bVar36 >> 2 & 1);
            bVar8 = (bool)(bVar36 >> 3 & 1);
            bVar9 = (bool)(bVar36 >> 4 & 1);
            bVar10 = (bool)(bVar36 >> 5 & 1);
            bVar11 = (bool)(bVar36 >> 6 & 1);
            auVar80 = ZEXT3264(CONCAT428((uint)(bVar36 >> 7) * auVar71._28_4_ |
                                         (uint)!(bool)(bVar36 >> 7) * auVar67._28_4_,
                                         CONCAT424((uint)bVar11 * auVar71._24_4_ |
                                                   (uint)!bVar11 * auVar67._24_4_,
                                                   CONCAT420((uint)bVar10 * auVar71._20_4_ |
                                                             (uint)!bVar10 * auVar67._20_4_,
                                                             CONCAT416((uint)bVar9 * auVar71._16_4_
                                                                       | (uint)!bVar9 *
                                                                         auVar67._16_4_,
                                                                       CONCAT412((uint)bVar8 *
                                                                                 auVar71._12_4_ |
                                                                                 (uint)!bVar8 *
                                                                                 auVar67._12_4_,
                                                                                 CONCAT48((uint)
                                                  bVar7 * auVar71._8_4_ |
                                                  (uint)!bVar7 * auVar67._8_4_,
                                                  CONCAT44((uint)bVar44 * auVar71._4_4_ |
                                                           (uint)!bVar44 * auVar67._4_4_,
                                                           auVar67._0_4_))))))));
          } while (bVar35 != 0);
          lVar25 = (ulong)(uint)POPCOUNT((uint)bVar22) + 3;
          while( true ) {
            auVar71 = auVar80._0_32_;
            auVar67 = vpermt2q_avx512vl(auVar69,auVar71,auVar70);
            sVar43 = auVar67._0_8_;
            bVar44 = lVar25 == 0;
            lVar25 = lVar25 + -1;
            if (bVar44) break;
            (local_25f0->ptr).ptr = sVar43;
            auVar67 = vpermd_avx2(auVar71,auVar68);
            local_25f0->dist = auVar67._0_4_;
            auVar67 = valignd_avx512vl(auVar71,auVar71,1);
            auVar80 = ZEXT3264(auVar67);
            local_25f0 = local_25f0 + 1;
          }
          auVar49 = vxorps_avx512vl(auVar91._0_16_,auVar91._0_16_);
          auVar91 = ZEXT1664(auVar49);
        } while( true );
      }
      goto LAB_01c61712;
    }
  }
  return;
LAB_01c61b10:
  if (lVar25 == local_25a0) goto LAB_01c62460;
  lVar26 = lVar25 * 0x50;
  local_25b0 = context->scene;
  pGVar5 = (context->scene->geometries).items[*(uint *)(uVar45 + 0x30 + lVar26)].ptr;
  fVar75 = (pGVar5->time_range).lower;
  fVar75 = pGVar5->fnumTimeSegments *
           (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar75) /
           ((pGVar5->time_range).upper - fVar75));
  auVar49 = vroundss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75),9);
  auVar49 = vminss_avx(auVar49,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar51 = vmaxss_avx512f(auVar91._0_16_,auVar49);
  lVar39 = (long)(int)auVar51._0_4_ * 0x38;
  lVar37 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar39);
  auVar49 = *(undefined1 (*) [16])(lVar37 + (ulong)*(uint *)(uVar45 + lVar26) * 4);
  uVar27 = (ulong)*(uint *)(uVar45 + 0x10 + lVar26);
  auVar50 = *(undefined1 (*) [16])(lVar37 + uVar27 * 4);
  uVar29 = CONCAT44(0,*(uint *)(uVar45 + 0x20 + lVar26));
  local_24d8._0_8_ = uVar29;
  auVar46 = *(undefined1 (*) [16])(lVar37 + uVar29 * 4);
  uVar30 = CONCAT44(0,*(uint *)(uVar45 + 4 + lVar26));
  local_24f8._0_8_ = uVar30;
  auVar47 = *(undefined1 (*) [16])(lVar37 + uVar30 * 4);
  uVar31 = CONCAT44(0,*(uint *)(uVar45 + 0x14 + lVar26));
  local_2518._0_8_ = uVar31;
  auVar48 = *(undefined1 (*) [16])(lVar37 + uVar31 * 4);
  uVar32 = CONCAT44(0,*(uint *)(uVar45 + 0x24 + lVar26));
  local_25c8._0_8_ = uVar32;
  auVar65 = *(undefined1 (*) [16])(lVar37 + uVar32 * 4);
  uVar33 = (ulong)*(uint *)(uVar45 + 8 + lVar26);
  auVar52 = *(undefined1 (*) [16])(lVar37 + uVar33 * 4);
  uVar42 = (ulong)*(uint *)(uVar45 + 0x18 + lVar26);
  auVar54 = *(undefined1 (*) [16])(lVar37 + uVar42 * 4);
  uVar41 = (ulong)*(uint *)(uVar45 + 0x28 + lVar26);
  auVar63 = *(undefined1 (*) [16])(lVar37 + uVar41 * 4);
  uVar40 = (ulong)*(uint *)(uVar45 + 0xc + lVar26);
  auVar64 = *(undefined1 (*) [16])(lVar37 + uVar40 * 4);
  uVar38 = (ulong)*(uint *)(uVar45 + 0x1c + lVar26);
  auVar62 = *(undefined1 (*) [16])(lVar37 + uVar38 * 4);
  lVar39 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar39);
  uVar34 = (ulong)*(uint *)(uVar45 + 0x2c + lVar26);
  auVar53 = *(undefined1 (*) [16])(lVar37 + uVar34 * 4);
  auVar55 = *(undefined1 (*) [16])(lVar39 + (ulong)*(uint *)(uVar45 + lVar26) * 4);
  auVar56 = *(undefined1 (*) [16])(lVar39 + uVar27 * 4);
  auVar59 = *(undefined1 (*) [16])(lVar39 + uVar29 * 4);
  auVar57 = *(undefined1 (*) [16])(lVar39 + uVar30 * 4);
  auVar58 = *(undefined1 (*) [16])(lVar39 + uVar31 * 4);
  auVar60 = *(undefined1 (*) [16])(lVar39 + uVar32 * 4);
  auVar61 = *(undefined1 (*) [16])(lVar39 + uVar33 * 4);
  auVar76 = *(undefined1 (*) [16])(lVar39 + uVar42 * 4);
  auVar3 = *(undefined1 (*) [16])(lVar39 + uVar41 * 4);
  auVar4 = *(undefined1 (*) [16])(lVar39 + uVar40 * 4);
  auVar66 = *(undefined1 (*) [16])(lVar39 + uVar38 * 4);
  auVar77 = *(undefined1 (*) [16])(lVar39 + uVar34 * 4);
  puVar1 = (undefined8 *)(uVar45 + 0x30 + lVar26);
  local_2408 = *puVar1;
  uStack_2400 = puVar1[1];
  puVar1 = (undefined8 *)(uVar45 + 0x40 + lVar26);
  auVar12 = vunpcklps_avx(auVar49,auVar52);
  auVar49 = vunpckhps_avx(auVar49,auVar52);
  auVar52 = vunpcklps_avx(auVar47,auVar64);
  auVar47 = vunpckhps_avx(auVar47,auVar64);
  auVar64 = vunpcklps_avx(auVar49,auVar47);
  auVar13 = vunpcklps_avx(auVar12,auVar52);
  auVar49 = vunpckhps_avx(auVar12,auVar52);
  auVar52 = vunpcklps_avx(auVar50,auVar54);
  auVar50 = vunpckhps_avx(auVar50,auVar54);
  auVar54 = vunpcklps_avx(auVar48,auVar62);
  auVar47 = vunpckhps_avx(auVar48,auVar62);
  auVar48 = vunpcklps_avx(auVar50,auVar47);
  auVar62 = vunpcklps_avx(auVar52,auVar54);
  auVar50 = vunpckhps_avx(auVar52,auVar54);
  auVar52 = vunpcklps_avx(auVar46,auVar63);
  auVar46 = vunpckhps_avx(auVar46,auVar63);
  auVar54 = vunpcklps_avx(auVar65,auVar53);
  auVar47 = vunpckhps_avx(auVar65,auVar53);
  auVar65 = vunpcklps_avx(auVar46,auVar47);
  auVar63 = vunpcklps_avx(auVar52,auVar54);
  auVar46 = vunpckhps_avx(auVar52,auVar54);
  auVar47 = vunpcklps_avx512vl(auVar55,auVar61);
  auVar52 = vunpckhps_avx512vl(auVar55,auVar61);
  auVar53 = vunpcklps_avx512vl(auVar57,auVar4);
  auVar54 = vunpckhps_avx512vl(auVar57,auVar4);
  auVar52 = vunpcklps_avx(auVar52,auVar54);
  auVar54 = vunpcklps_avx(auVar47,auVar53);
  auVar47 = vunpckhps_avx(auVar47,auVar53);
  auVar53 = vunpcklps_avx512vl(auVar56,auVar76);
  auVar55 = vunpckhps_avx512vl(auVar56,auVar76);
  auVar56 = vunpcklps_avx512vl(auVar58,auVar66);
  auVar57 = vunpckhps_avx512vl(auVar58,auVar66);
  auVar55 = vunpcklps_avx512vl(auVar55,auVar57);
  auVar57 = vunpcklps_avx512vl(auVar53,auVar56);
  auVar56 = vunpckhps_avx512vl(auVar53,auVar56);
  auVar58 = vunpcklps_avx512vl(auVar59,auVar3);
  auVar53 = vunpckhps_avx512vl(auVar59,auVar3);
  auVar59 = vunpcklps_avx512vl(auVar60,auVar77);
  auVar60 = vunpckhps_avx512vl(auVar60,auVar77);
  auVar53 = vunpcklps_avx(auVar53,auVar60);
  auVar60 = vunpcklps_avx512vl(auVar58,auVar59);
  auVar59 = vunpckhps_avx512vl(auVar58,auVar59);
  auVar61 = ZEXT416((uint)(fVar75 - auVar51._0_4_));
  auVar58 = vbroadcastss_avx512vl(auVar61);
  auVar61 = vsubss_avx512f(ZEXT416(0x3f800000),auVar61);
  auVar76._0_4_ = auVar61._0_4_;
  auVar76._4_4_ = auVar76._0_4_;
  auVar76._8_4_ = auVar76._0_4_;
  auVar76._12_4_ = auVar76._0_4_;
  auVar54 = vmulps_avx512vl(auVar58,auVar54);
  auVar47 = vmulps_avx512vl(auVar58,auVar47);
  auVar61 = vmulps_avx512vl(auVar58,auVar52);
  auVar52 = vfmadd231ps_fma(auVar54,auVar76,auVar13);
  auVar54 = vfmadd231ps_fma(auVar47,auVar76,auVar49);
  auVar64 = vfmadd231ps_fma(auVar61,auVar76,auVar64);
  auVar49 = vmulps_avx512vl(auVar58,auVar57);
  auVar47 = vmulps_avx512vl(auVar58,auVar56);
  auVar55 = vmulps_avx512vl(auVar58,auVar55);
  auVar49 = vfmadd231ps_fma(auVar49,auVar76,auVar62);
  auVar50 = vfmadd231ps_fma(auVar47,auVar76,auVar50);
  auVar47 = vfmadd231ps_fma(auVar55,auVar76,auVar48);
  auVar48 = vmulps_avx512vl(auVar58,auVar60);
  auVar62 = vmulps_avx512vl(auVar58,auVar59);
  auVar53 = vmulps_avx512vl(auVar58,auVar53);
  auVar48 = vfmadd231ps_fma(auVar48,auVar76,auVar63);
  auVar63 = vfmadd231ps_fma(auVar62,auVar76,auVar46);
  auVar65 = vfmadd231ps_fma(auVar53,auVar76,auVar65);
  local_2528 = *puVar1;
  uStack_2520 = puVar1[1];
  auVar49 = vsubps_avx(auVar52,auVar49);
  auVar50 = vsubps_avx(auVar54,auVar50);
  auVar46 = vsubps_avx(auVar64,auVar47);
  auVar47 = vsubps_avx(auVar48,auVar52);
  auVar48 = vsubps_avx(auVar63,auVar54);
  auVar65 = vsubps_avx(auVar65,auVar64);
  auVar53._0_4_ = auVar65._0_4_ * auVar50._0_4_;
  auVar53._4_4_ = auVar65._4_4_ * auVar50._4_4_;
  auVar53._8_4_ = auVar65._8_4_ * auVar50._8_4_;
  auVar53._12_4_ = auVar65._12_4_ * auVar50._12_4_;
  local_2438 = vfmsub231ps_fma(auVar53,auVar48,auVar46);
  auVar55._0_4_ = auVar46._0_4_ * auVar47._0_4_;
  auVar55._4_4_ = auVar46._4_4_ * auVar47._4_4_;
  auVar55._8_4_ = auVar46._8_4_ * auVar47._8_4_;
  auVar55._12_4_ = auVar46._12_4_ * auVar47._12_4_;
  local_2428 = vfmsub231ps_fma(auVar55,auVar65,auVar49);
  auVar56._0_4_ = auVar49._0_4_ * auVar48._0_4_;
  auVar56._4_4_ = auVar49._4_4_ * auVar48._4_4_;
  auVar56._8_4_ = auVar49._8_4_ * auVar48._8_4_;
  auVar56._12_4_ = auVar49._12_4_ * auVar48._12_4_;
  fVar75 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar57._4_4_ = fVar75;
  auVar57._0_4_ = fVar75;
  auVar57._8_4_ = fVar75;
  auVar57._12_4_ = fVar75;
  auVar53 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
  auVar55 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]));
  uVar81 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar63._4_4_ = uVar81;
  auVar63._0_4_ = uVar81;
  auVar63._8_4_ = uVar81;
  auVar63._12_4_ = uVar81;
  auVar63 = vsubps_avx512vl(auVar52,auVar63);
  local_2418 = vfmsub231ps_fma(auVar56,auVar47,auVar50);
  uVar81 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar62._4_4_ = uVar81;
  auVar62._0_4_ = uVar81;
  auVar62._8_4_ = uVar81;
  auVar62._12_4_ = uVar81;
  auVar62 = vsubps_avx512vl(auVar54,auVar62);
  uVar81 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar54._4_4_ = uVar81;
  auVar54._0_4_ = uVar81;
  auVar54._8_4_ = uVar81;
  auVar54._12_4_ = uVar81;
  auVar54 = vsubps_avx512vl(auVar64,auVar54);
  auVar52 = vmulps_avx512vl(auVar53,auVar54);
  auVar56 = vfmsub231ps_avx512vl(auVar52,auVar62,auVar55);
  auVar52 = vmulps_avx512vl(auVar55,auVar63);
  auVar52 = vfmsub231ps_fma(auVar52,auVar54,auVar57);
  auVar59._0_4_ = fVar75 * auVar62._0_4_;
  auVar59._4_4_ = fVar75 * auVar62._4_4_;
  auVar59._8_4_ = fVar75 * auVar62._8_4_;
  auVar59._12_4_ = fVar75 * auVar62._12_4_;
  auVar59 = vfmsub231ps_avx512vl(auVar59,auVar63,auVar53);
  auVar64 = vmulps_avx512vl(local_2418,auVar55);
  auVar64 = vfmadd231ps_avx512vl(auVar64,local_2428,auVar53);
  auVar53 = vfmadd231ps_avx512vl(auVar64,local_2438,auVar57);
  auVar64._8_4_ = 0x7fffffff;
  auVar64._0_8_ = 0x7fffffff7fffffff;
  auVar64._12_4_ = 0x7fffffff;
  local_2488 = vandps_avx512vl(auVar53,auVar64);
  auVar65 = vmulps_avx512vl(auVar65,auVar59);
  auVar48 = vfmadd231ps_avx512vl(auVar65,auVar52,auVar48);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar56,auVar47);
  auVar47._8_4_ = 0x80000000;
  auVar47._0_8_ = 0x8000000080000000;
  auVar47._12_4_ = 0x80000000;
  auVar47 = vandpd_avx512vl(auVar53,auVar47);
  local_24b8 = vxorps_avx512vl(auVar47,auVar48);
  auVar48._0_4_ = auVar46._0_4_ * auVar59._0_4_;
  auVar48._4_4_ = auVar46._4_4_ * auVar59._4_4_;
  auVar48._8_4_ = auVar46._8_4_ * auVar59._8_4_;
  auVar48._12_4_ = auVar46._12_4_ * auVar59._12_4_;
  auVar50 = vfmadd231ps_fma(auVar48,auVar50,auVar52);
  auVar49 = vfmadd231ps_fma(auVar50,auVar49,auVar56);
  local_24a8._0_4_ = (float)(auVar47._0_4_ ^ auVar49._0_4_);
  local_24a8._4_4_ = (float)(auVar47._4_4_ ^ auVar49._4_4_);
  local_24a8._8_4_ = (float)(auVar47._8_4_ ^ auVar49._8_4_);
  local_24a8._12_4_ = (float)(auVar47._12_4_ ^ auVar49._12_4_);
  auVar49 = ZEXT816(0) << 0x20;
  uVar19 = vcmpps_avx512vl(local_24b8,auVar49,5);
  uVar16 = vcmpps_avx512vl(local_24a8,auVar49,5);
  uVar17 = vcmpps_avx512vl(auVar53,auVar49,4);
  auVar46._0_4_ = local_24b8._0_4_ + local_24a8._0_4_;
  auVar46._4_4_ = local_24b8._4_4_ + local_24a8._4_4_;
  auVar46._8_4_ = local_24b8._8_4_ + local_24a8._8_4_;
  auVar46._12_4_ = local_24b8._12_4_ + local_24a8._12_4_;
  uVar18 = vcmpps_avx512vl(auVar46,local_2488,2);
  bVar22 = (byte)uVar19 & (byte)uVar16 & (byte)uVar17 & (byte)uVar18;
  context = local_25d0;
  if (bVar22 != 0) {
    auVar61._0_4_ = auVar54._0_4_ * local_2418._0_4_;
    auVar61._4_4_ = auVar54._4_4_ * local_2418._4_4_;
    auVar61._8_4_ = auVar54._8_4_ * local_2418._8_4_;
    auVar61._12_4_ = auVar54._12_4_ * local_2418._12_4_;
    auVar49 = vfmadd213ps_fma(auVar62,local_2428,auVar61);
    auVar49 = vfmadd213ps_fma(auVar63,local_2438,auVar49);
    local_2498._0_4_ = (float)(auVar47._0_4_ ^ auVar49._0_4_);
    local_2498._4_4_ = (float)(auVar47._4_4_ ^ auVar49._4_4_);
    local_2498._8_4_ = (float)(auVar47._8_4_ ^ auVar49._8_4_);
    local_2498._12_4_ = (float)(auVar47._12_4_ ^ auVar49._12_4_);
    uVar81 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar58._4_4_ = uVar81;
    auVar58._0_4_ = uVar81;
    auVar58._8_4_ = uVar81;
    auVar58._12_4_ = uVar81;
    auVar49 = vmulps_avx512vl(local_2488,auVar58);
    fVar75 = (ray->super_RayK<1>).tfar;
    auVar60._4_4_ = fVar75;
    auVar60._0_4_ = fVar75;
    auVar60._8_4_ = fVar75;
    auVar60._12_4_ = fVar75;
    auVar50 = vmulps_avx512vl(local_2488,auVar60);
    uVar19 = vcmpps_avx512vl(local_2498,auVar50,2);
    uVar16 = vcmpps_avx512vl(auVar49,local_2498,1);
    bVar22 = (byte)uVar19 & (byte)uVar16 & bVar22;
    if (bVar22 != 0) {
      auVar3._0_4_ = (ray->super_RayK<1>).tfar;
      auVar3._4_4_ = (ray->super_RayK<1>).mask;
      auVar3._8_4_ = (ray->super_RayK<1>).id;
      auVar3._12_4_ = (ray->super_RayK<1>).flags;
      auVar80 = ZEXT1664(auVar3);
      uVar23 = vextractps_avx(auVar3,1);
      local_2477 = bVar22;
      auVar49 = vrcp14ps_avx512vl(local_2488);
      auVar4._8_4_ = 0x3f800000;
      auVar4._0_8_ = 0x3f8000003f800000;
      auVar4._12_4_ = 0x3f800000;
      auVar50 = vfnmadd213ps_avx512vl(local_2488,auVar49,auVar4);
      auVar49 = vfmadd132ps_fma(auVar50,auVar49,auVar49);
      fVar75 = auVar49._0_4_;
      local_2448._0_4_ = fVar75 * local_2498._0_4_;
      fVar82 = auVar49._4_4_;
      local_2448._4_4_ = fVar82 * local_2498._4_4_;
      fVar83 = auVar49._8_4_;
      local_2448._8_4_ = fVar83 * local_2498._8_4_;
      fVar84 = auVar49._12_4_;
      local_2448._12_4_ = fVar84 * local_2498._12_4_;
      auVar79 = ZEXT1664(local_2448);
      local_2468[0] = fVar75 * local_24b8._0_4_;
      local_2468[1] = fVar82 * local_24b8._4_4_;
      local_2468[2] = fVar83 * local_24b8._8_4_;
      local_2468[3] = fVar84 * local_24b8._12_4_;
      local_2458[0] = fVar75 * local_24a8._0_4_;
      local_2458[1] = fVar82 * local_24a8._4_4_;
      local_2458[2] = fVar83 * local_24a8._8_4_;
      local_2458[3] = fVar84 * local_24a8._12_4_;
      auVar77._8_4_ = 0x7f800000;
      auVar77._0_8_ = 0x7f8000007f800000;
      auVar77._12_4_ = 0x7f800000;
      auVar49 = vblendmps_avx512vl(auVar77,local_2448);
      auVar66._0_4_ = (uint)(bVar22 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar22 & 1) * 0x7f800000;
      bVar44 = (bool)(bVar22 >> 1 & 1);
      auVar66._4_4_ = (uint)bVar44 * auVar49._4_4_ | (uint)!bVar44 * 0x7f800000;
      bVar44 = (bool)(bVar22 >> 2 & 1);
      auVar66._8_4_ = (uint)bVar44 * auVar49._8_4_ | (uint)!bVar44 * 0x7f800000;
      bVar44 = (bool)(bVar22 >> 3 & 1);
      auVar66._12_4_ = (uint)bVar44 * auVar49._12_4_ | (uint)!bVar44 * 0x7f800000;
      auVar49 = vshufps_avx(auVar66,auVar66,0xb1);
      auVar49 = vminps_avx(auVar49,auVar66);
      auVar50 = vshufpd_avx(auVar49,auVar49,1);
      auVar49 = vminps_avx(auVar50,auVar49);
      uVar19 = vcmpps_avx512vl(auVar66,auVar49,0);
      bVar35 = bVar22;
      if (((byte)uVar19 & bVar22) != 0) {
        bVar35 = (byte)uVar19 & bVar22;
      }
LAB_01c62082:
      auVar50 = auVar91._0_16_;
      auVar49 = auVar79._0_16_;
      uVar20 = 0;
      for (uVar28 = (uint)bVar35; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
        uVar20 = uVar20 + 1;
      }
      h.geomID = *(uint *)((long)&local_2408 + (ulong)uVar20 * 4);
      local_25b8 = (local_25b0->geometries).items[h.geomID].ptr;
      if ((local_25b8->mask & uVar23) == 0) {
        bVar22 = ~(byte)(1 << (uVar20 & 0x1f)) & bVar22;
      }
      else {
        pRVar6 = context->args;
        auVar69 = auVar94._0_32_;
        auVar68 = auVar93._0_32_;
        auVar67 = auVar92._0_32_;
        if (pRVar6->filter == (RTCFilterFunctionN)0x0) {
          args.context = context->user;
          if (local_25b8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
            uVar27 = (ulong)(uVar20 << 2);
            fVar75 = *(float *)((long)local_2468 + uVar27);
            fVar82 = *(float *)((long)local_2458 + uVar27);
            (ray->super_RayK<1>).tfar = *(float *)(local_2448 + uVar27);
            (ray->Ng).field_0.field_0.x = *(float *)(local_2438 + uVar27);
            (ray->Ng).field_0.field_0.y = *(float *)(local_2428 + uVar27);
            (ray->Ng).field_0.field_0.z = *(float *)(local_2418 + uVar27);
            ray->u = fVar75;
            ray->v = fVar82;
            ray->primID = *(uint *)((long)&local_2528 + uVar27);
            ray->geomID = h.geomID;
            ray->instID[0] = (args.context)->instID[0];
            ray->instPrimID[0] = (args.context)->instPrimID[0];
            goto LAB_01c61f43;
          }
          local_25c8 = auVar49;
          local_2518 = auVar69;
          local_24f8 = auVar68;
          local_24d8 = auVar67;
        }
        else {
          local_25c8 = auVar49;
          local_2518 = auVar69;
          local_24f8 = auVar68;
          local_24d8 = auVar67;
          args.context = context->user;
        }
        uVar27 = (ulong)(uVar20 * 4);
        h.Ng.field_0.field_0.x = *(float *)(local_2438 + uVar27);
        h.Ng.field_0.field_0.y = *(float *)(local_2428 + uVar27);
        h.Ng.field_0.field_0.z = *(float *)(local_2418 + uVar27);
        h.u = *(float *)((long)local_2468 + uVar27);
        h.v = *(float *)((long)local_2458 + uVar27);
        h.primID = *(uint *)((long)&local_2528 + uVar27);
        h.instID[0] = (args.context)->instID[0];
        h.instPrimID[0] = (args.context)->instPrimID[0];
        (ray->super_RayK<1>).tfar = *(float *)(local_2448 + uVar27);
        local_25d4 = -1;
        args.valid = &local_25d4;
        args.geometryUserPtr = local_25b8->userPtr;
        args.ray = (RTCRayN *)ray;
        args.hit = (RTCHitN *)&h;
        args.N = 1;
        local_25c8 = auVar49;
        local_2518 = auVar69;
        local_24f8 = auVar68;
        local_24d8 = auVar67;
        if (((local_25b8->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
            ((*local_25b8->intersectionFilterN)(&args), *args.valid != 0)) &&
           ((pRVar6->filter == (RTCFilterFunctionN)0x0 ||
            ((((pRVar6->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
               RTC_RAY_QUERY_FLAG_INCOHERENT && (((local_25b8->field_8).field_0x2 & 0x40) == 0)) ||
             ((*pRVar6->filter)(&args), *args.valid != 0)))))) {
          *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
          *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
          *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
          *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
          *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
          *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
          *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
          *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
          *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
        }
        else {
          local_2538 = auVar80._0_4_;
          (ray->super_RayK<1>).tfar = local_2538;
        }
        auVar12._0_4_ = (ray->super_RayK<1>).tfar;
        auVar12._4_4_ = (ray->super_RayK<1>).mask;
        auVar12._8_4_ = (ray->super_RayK<1>).id;
        auVar12._12_4_ = (ray->super_RayK<1>).flags;
        auVar80 = ZEXT1664(auVar12);
        auVar79 = ZEXT1664(local_25c8);
        fVar75 = (ray->super_RayK<1>).tfar;
        auVar13._4_4_ = fVar75;
        auVar13._0_4_ = fVar75;
        auVar13._8_4_ = fVar75;
        auVar13._12_4_ = fVar75;
        uVar19 = vcmpps_avx512vl(local_25c8,auVar13,2);
        bVar22 = ~(byte)(1 << (uVar20 & 0x1f)) & bVar22 & (byte)uVar19;
        uVar23 = vextractps_avx(auVar12,1);
        auVar49 = vxorps_avx512vl(auVar50,auVar50);
        auVar91 = ZEXT1664(auVar49);
        auVar92 = ZEXT3264(local_24d8);
        auVar93 = ZEXT3264(local_24f8);
        auVar94 = ZEXT3264(local_2518);
        auVar67 = vbroadcastss_avx512vl(ZEXT416(1));
        auVar95 = ZEXT3264(auVar67);
        context = local_25d0;
      }
      if (bVar22 == 0) goto LAB_01c61f43;
      auVar78._8_4_ = 0x7f800000;
      auVar78._0_8_ = 0x7f8000007f800000;
      auVar78._12_4_ = 0x7f800000;
      auVar49 = vblendmps_avx512vl(auVar78,auVar79._0_16_);
      auVar51._0_4_ = (uint)(bVar22 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar22 & 1) * 0x7f800000;
      bVar44 = (bool)(bVar22 >> 1 & 1);
      auVar51._4_4_ = (uint)bVar44 * auVar49._4_4_ | (uint)!bVar44 * 0x7f800000;
      bVar44 = (bool)(bVar22 >> 2 & 1);
      auVar51._8_4_ = (uint)bVar44 * auVar49._8_4_ | (uint)!bVar44 * 0x7f800000;
      bVar44 = (bool)(bVar22 >> 3 & 1);
      auVar51._12_4_ = (uint)bVar44 * auVar49._12_4_ | (uint)!bVar44 * 0x7f800000;
      auVar49 = vshufps_avx(auVar51,auVar51,0xb1);
      auVar49 = vminps_avx(auVar49,auVar51);
      auVar50 = vshufpd_avx(auVar49,auVar49,1);
      auVar49 = vminps_avx(auVar50,auVar49);
      uVar19 = vcmpps_avx512vl(auVar51,auVar49,0);
      bVar36 = (byte)uVar19 & bVar22;
      bVar35 = bVar22;
      if (bVar36 != 0) {
        bVar35 = bVar36;
      }
      goto LAB_01c62082;
    }
  }
LAB_01c61f43:
  lVar25 = lVar25 + 1;
  auVar85 = ZEXT3264(local_2398);
  auVar86 = ZEXT3264(local_23b8);
  auVar87 = ZEXT3264(local_23d8);
  auVar88 = ZEXT3264(local_23f8);
  lVar37 = local_25a8;
  goto LAB_01c61b10;
LAB_01c62460:
  fVar75 = (ray->super_RayK<1>).tfar;
  auVar79 = ZEXT3264(CONCAT428(fVar75,CONCAT424(fVar75,CONCAT420(fVar75,CONCAT416(fVar75,CONCAT412(
                                                  fVar75,CONCAT48(fVar75,CONCAT44(fVar75,fVar75)))))
                                               )));
  auVar80 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
  auVar67 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar89 = ZEXT3264(auVar67);
  auVar90 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  goto LAB_01c61712;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }